

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O0

maybe<pstore::command_line::option_*,_void> *
pstore::command_line::details::lookup_nearest_option
          (maybe<pstore::command_line::option_*,_void> *__return_storage_ptr__,string *arg,
          options_container *all_options)

{
  bool bVar1;
  ulong uVar2;
  reference other;
  string *from;
  options_container *poVar3;
  size_type distance;
  option **opt;
  const_iterator __end2;
  const_iterator __begin2;
  options_container *__range2;
  unsigned_long best_distance;
  options_container *all_options_local;
  string *arg_local;
  maybe<pstore::command_line::option_*,_void> *best_option;
  
  nothing<pstore::command_line::option*>();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    __range2 = (options_container *)std::numeric_limits<unsigned_long>::max();
    __end2 = std::__cxx11::
             list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::
             begin(all_options);
    opt = (option **)
          std::__cxx11::
          list<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>::end
                    (all_options);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&opt), bVar1) {
      other = std::_List_const_iterator<pstore::command_line::option_*>::operator*(&__end2);
      from = option::name_abi_cxx11_(*other);
      poVar3 = (options_container *)string_distance(from,arg,(size_type)__range2);
      if (poVar3 < __range2) {
        maybe<pstore::command_line::option*,void>::operator=
                  ((maybe<pstore::command_line::option*,void> *)__return_storage_ptr__,other);
        __range2 = poVar3;
      }
      std::_List_const_iterator<pstore::command_line::option_*>::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<option *>
                lookup_nearest_option (std::string const & arg,
                                       option::options_container const & all_options) {
                    auto best_option = nothing<option *> ();
                    if (arg.empty ()) {
                        return best_option;
                    }
                    // Find the closest match.
                    auto best_distance = std::numeric_limits<std::string::size_type>::max ();
                    for (auto const & opt : all_options) {
                        auto const distance = string_distance (opt->name (), arg, best_distance);
                        if (distance < best_distance) {
                            best_option = opt;
                            best_distance = distance;
                        }
                    }
                    return best_option;
                }